

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::is_chunked_transfer_encoding(Headers *headers)

{
  bool bVar1;
  string *in_RDI;
  size_t in_stack_ffffffffffffff60;
  string *key;
  Headers *in_stack_ffffffffffffff78;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator<char> local_5d [20];
  undefined1 local_49 [33];
  string local_28 [40];
  
  key = (string *)local_49;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  get_header_value(in_stack_ffffffffffffff78,key,(char *)in_RDI,in_stack_ffffffffffffff60);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  bVar1 = case_ignore::equal(key,in_RDI);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  ::std::__cxx11::string::~string(local_28);
  ::std::allocator<char>::~allocator(local_5d);
  ::std::__cxx11::string::~string((string *)(local_49 + 1));
  ::std::allocator<char>::~allocator((allocator<char> *)local_49);
  return bVar1;
}

Assistant:

inline bool is_chunked_transfer_encoding(const Headers &headers) {
  return case_ignore::equal(
      get_header_value(headers, "Transfer-Encoding", "", 0), "chunked");
}